

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::GlobalObject::HasPropertyQuery(GlobalObject *this,PropertyId propertyId,PropertyValueInfo *info)

{
  RecyclableObject *pRVar1;
  PropertyQueryFlags PVar2;
  BOOL BVar3;
  PropertyQueryFlags PVar4;
  
  PVar2 = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,info);
  PVar4 = Property_Found;
  if (PVar2 != Property_Found) {
    pRVar1 = (this->directHostObject).ptr;
    if ((pRVar1 != (RecyclableObject *)0x0) &&
       (BVar3 = JavascriptOperators::HasProperty(pRVar1,propertyId), BVar3 != 0)) {
      return Property_Found;
    }
    pRVar1 = (RecyclableObject *)(this->super_RootObjectBase).hostObject.ptr;
    if (pRVar1 == (RecyclableObject *)0x0) {
      PVar4 = Property_NotFound;
    }
    else {
      BVar3 = JavascriptOperators::HasProperty(pRVar1,propertyId);
      PVar4 = (PropertyQueryFlags)(BVar3 != 0);
    }
  }
  return PVar4;
}

Assistant:

PropertyQueryFlags GlobalObject::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        return JavascriptConversion::BooleanToPropertyQueryFlags(JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, info)) ||
            (this->directHostObject && JavascriptOperators::HasProperty(this->directHostObject, propertyId)) ||
            (this->hostObject && JavascriptOperators::HasProperty(this->hostObject, propertyId)));
    }